

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

void getKktFailures(HighsOptions *options,HighsLp *lp,
                   vector<double,_std::allocator<double>_> *gradient,HighsSolution *solution,
                   HighsBasis *basis,HighsInfo *highs_info,HighsPrimalDualErrors *primal_dual_errors
                   ,bool get_residuals)

{
  double dVar1;
  double dVar2;
  pointer pHVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  HighsLp *pHVar7;
  HighsSolution *pHVar8;
  bool bVar9;
  double *pdVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  double *pdVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  HighsInt *pHVar20;
  double *pdVar21;
  uint uVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  byte bVar26;
  HighsInt iCol;
  long lVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double absolute_primal_infeasibility;
  double value_residual;
  double dual_infeasibility;
  vector<double,_std::allocator<double>_> dual_negative_sum;
  vector<double,_std::allocator<double>_> dual_positive_sum;
  vector<double,_std::allocator<double>_> primal_negative_sum;
  vector<double,_std::allocator<double>_> primal_positive_sum;
  double relative_primal_infeasibility;
  double check_sum_complementarity_violations;
  double check_max_complementarity_violation;
  HighsBasisStatus local_1f9;
  HighsLp *local_1f8;
  HighsSolution *local_1f0;
  HighsBasis *local_1e8;
  pointer local_1e0;
  undefined4 local_1d4;
  double *local_1d0;
  double *local_1c8;
  ulong local_1c0;
  pointer local_1b8;
  HighsError *local_1b0;
  HighsError *local_1a8;
  double local_1a0;
  pointer local_198;
  value_type_conflict1 local_190;
  double *local_188;
  HighsInt *local_180;
  HighsInt *local_178;
  HighsInt *local_170;
  double *local_168;
  double *local_160;
  HighsInt *local_158;
  double *local_150;
  double *local_148;
  HighsInt *local_140;
  double *local_138;
  HighsOptions *local_130;
  double local_128;
  double *local_120;
  double local_118;
  double local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  HighsInt *local_90;
  HighsInt *local_88;
  HighsInt *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  double *local_70;
  pointer local_68;
  pointer local_60;
  HighsBasisStatus *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_1a0 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_128 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  pdVar15 = &(highs_info->super_HighsInfoStruct).max_primal_infeasibility;
  local_1d0 = &(highs_info->super_HighsInfoStruct).max_dual_infeasibility;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_primal_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_primal_infeasibility).relative_index = -1;
  (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).absolute_index = -1;
  (primal_dual_errors->max_dual_infeasibility).relative_value = INFINITY;
  (primal_dual_errors->max_dual_infeasibility).relative_index = -1;
  (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  (highs_info->super_HighsInfoStruct).max_complementarity_violation = INFINITY;
  (highs_info->super_HighsInfoStruct).sum_complementarity_violations = INFINITY;
  local_60 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_68 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar9 = solution->value_valid;
  if (bVar9 == false) {
    local_1c0 = CONCAT71((int7)((ulong)lp >> 8),get_residuals) & 0xffffffff ^ 1;
    bVar11 = solution->dual_valid;
LAB_00254721:
    primal_dual_errors->num_primal_residual = -1;
    primal_dual_errors->sum_primal_residual = INFINITY;
    (primal_dual_errors->max_primal_residual).absolute_value = INFINITY;
    (primal_dual_errors->max_primal_residual).absolute_index = -1;
    (primal_dual_errors->max_primal_residual).relative_value = INFINITY;
    (primal_dual_errors->max_primal_residual).relative_index = -1;
  }
  else {
    (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
    *pdVar15 = 0.0;
    (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).absolute_index = 0;
    (primal_dual_errors->max_primal_infeasibility).relative_value = 0.0;
    (primal_dual_errors->max_primal_infeasibility).relative_index = 0;
    bVar11 = solution->dual_valid;
    if ((bool)bVar11 == true) {
      (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
      *local_1d0 = 0.0;
      (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).absolute_index = 0;
      (primal_dual_errors->max_dual_infeasibility).relative_value = 0.0;
      (primal_dual_errors->max_dual_infeasibility).relative_index = 0;
    }
    if (!get_residuals) {
      local_1c0 = CONCAT71((int7)((ulong)&primal_dual_errors->sum_off_bound_nonbasic >> 8),1);
      goto LAB_00254721;
    }
    primal_dual_errors->num_primal_residual = 0;
    primal_dual_errors->sum_primal_residual = 0.0;
    (primal_dual_errors->max_primal_residual).absolute_value = 0.0;
    (primal_dual_errors->max_primal_residual).absolute_index = 0;
    (primal_dual_errors->max_primal_residual).relative_value = 0.0;
    local_1c0 = 0;
    (primal_dual_errors->max_primal_residual).relative_index = 0;
  }
  local_138 = &primal_dual_errors->sum_dual_residual;
  local_140 = &primal_dual_errors->num_off_bound_nonbasic;
  local_148 = &primal_dual_errors->max_off_bound_nonbasic;
  local_150 = &primal_dual_errors->sum_off_bound_nonbasic;
  local_158 = &primal_dual_errors->num_large_nonzero_basic_duals;
  local_160 = &primal_dual_errors->max_nonzero_basic_dual;
  local_168 = &primal_dual_errors->sum_nonzero_basic_duals;
  local_170 = &primal_dual_errors->num_dual_residual;
  local_178 = &(primal_dual_errors->max_dual_residual).absolute_index;
  local_180 = &(primal_dual_errors->max_dual_residual).relative_index;
  local_188 = &(primal_dual_errors->max_dual_residual).relative_value;
  local_1b0 = &primal_dual_errors->max_dual_residual;
  local_70 = &primal_dual_errors->sum_primal_residual;
  local_120 = &(primal_dual_errors->max_primal_residual).relative_value;
  local_88 = &(primal_dual_errors->max_primal_residual).relative_index;
  local_80 = &(primal_dual_errors->max_primal_residual).absolute_index;
  local_1a8 = &primal_dual_errors->max_primal_residual;
  bVar11 = bVar11 ^ 1 | (byte)local_1c0;
  iVar12 = -(bVar11 & 1);
  dVar31 = 0.0;
  dVar32 = INFINITY;
  if ((bVar11 & 1) == 0) {
    dVar32 = 0.0;
  }
  primal_dual_errors->num_dual_residual = iVar12;
  primal_dual_errors->sum_dual_residual = dVar32;
  (primal_dual_errors->max_dual_residual).absolute_value = dVar32;
  (primal_dual_errors->max_dual_residual).absolute_index = iVar12;
  (primal_dual_errors->max_dual_residual).relative_value = dVar32;
  (primal_dual_errors->max_dual_residual).relative_index = iVar12;
  iVar12 = basis->valid - 1;
  if (basis->valid == false) {
    dVar31 = INFINITY;
  }
  primal_dual_errors->num_nonzero_basic_duals = iVar12;
  primal_dual_errors->num_large_nonzero_basic_duals = iVar12;
  primal_dual_errors->max_nonzero_basic_dual = dVar31;
  primal_dual_errors->sum_nonzero_basic_duals = dVar31;
  primal_dual_errors->num_off_bound_nonbasic = iVar12;
  primal_dual_errors->max_off_bound_nonbasic = dVar31;
  primal_dual_errors->sum_off_bound_nonbasic = dVar31;
  if (bVar9 == false) {
    return;
  }
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8 = lp;
  local_1e8 = basis;
  local_130 = options;
  local_78 = gradient;
  if (get_residuals) {
    local_190 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_a8,(long)lp->num_row_,&local_190);
    local_190 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_c8,(long)lp->num_row_,&local_190);
    if (solution->dual_valid == true) {
      std::vector<double,_std::allocator<double>_>::resize(&local_e8,(long)local_1f8->num_col_);
      std::vector<double,_std::allocator<double>_>::resize(&local_108,(long)local_1f8->num_col_);
    }
  }
  local_1f9 = kNonbasic;
  bVar11 = local_1e8->valid;
  local_58 = &local_1f9;
  if ((bool)bVar11 == false) {
    local_58 = (HighsBasisStatus *)0x0;
  }
  uVar29 = local_1f8->num_col_;
  uVar30 = (ulong)uVar29;
  iVar12 = local_1f8->num_row_;
  uVar22 = iVar12 + uVar29;
  local_1f0 = solution;
  local_1c8 = pdVar15;
  local_90 = &primal_dual_errors->num_primal_residual;
  if (uVar22 == 0 || SCARRY4(iVar12,uVar29) != (int)uVar22 < 0) {
    bVar26 = solution->dual_valid;
  }
  else {
    local_130 = (HighsOptions *)&(local_130->super_HighsOptionsStruct).log_options;
    lVar27 = 0;
    local_198 = (pointer)0x0;
    local_1d4 = 0;
    do {
      pHVar8 = local_1f0;
      iVar28 = (int)uVar30;
      iVar12 = (int)lVar27;
      if (lVar27 < iVar28) {
        if (local_1f0->dual_valid == true) {
          local_198 = (pointer)(local_1f0->col_dual).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar27];
        }
        if ((bVar11 & 1) != 0) {
          local_1f9 = (local_1e8->col_status).
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar27];
        }
        local_1e0 = (pointer)(local_1f8->col_lower_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27];
        local_50 = (local_1f8->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar27];
        local_1b8 = (pointer)(local_1f0->col_value).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27];
        if (local_68 != local_60) {
          pHVar3 = (local_1f8->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1d4 = (undefined4)CONCAT71((int7)((ulong)pHVar3 >> 8),pHVar3[lVar27]);
        }
      }
      else {
        iVar13 = iVar12 - iVar28;
        if (local_1f0->dual_valid == true) {
          local_198 = (pointer)(local_1f0->row_dual).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar13];
        }
        local_1e0 = (pointer)(local_1f8->row_lower_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar13];
        local_50 = (local_1f8->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar13];
        local_1b8 = (pointer)(local_1f0->row_value).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar13];
        if ((bVar11 & 1) != 0) {
          local_1f9 = (local_1e8->row_status).
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar13];
        }
        local_1d4 = 0;
      }
      local_198 = (pointer)((double)local_1f8->sense_ * (double)local_198);
      bVar9 = getVariableKktFailures
                        (local_1a0,(double)local_1e0,(double)local_1e0,local_50,(double)local_1b8,
                         (double)local_198,local_58,(HighsVarType)local_1d4,&local_190,&local_48,
                         &local_110,&local_118);
      if (!bVar9) {
        pcVar14 = "Row   ";
        if (lVar27 < iVar28) {
          pcVar14 = "Column";
          iVar28 = 0;
        }
        highsLogUser((HighsLogOptions *)local_130,kError,
                     "getKktFailures: %s %d status-value error: [%23.18g; %23.18g; %23.18g] has residual %g\n"
                     ,local_1e0,local_1b8,local_50,local_118,pcVar14,(ulong)(uint)(iVar12 - iVar28))
        ;
      }
      if (local_1a0 < local_190) {
        pHVar20 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar20 = *pHVar20 + 1;
      }
      if (*local_1c8 <= local_190 && local_190 != *local_1c8) {
        (primal_dual_errors->max_primal_infeasibility).absolute_index = iVar12;
        *local_1c8 = local_190;
      }
      pdVar15 = &(primal_dual_errors->max_primal_infeasibility).relative_value;
      if (*pdVar15 <= local_48 && local_48 != *pdVar15) {
        (primal_dual_errors->max_primal_infeasibility).relative_index = iVar12;
        (primal_dual_errors->max_primal_infeasibility).relative_value = local_48;
      }
      (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
           local_190 + (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities;
      bVar26 = pHVar8->dual_valid;
      if ((bool)bVar26 == true) {
        if (local_128 < local_110) {
          pHVar20 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
          *pHVar20 = *pHVar20 + 1;
        }
        if (*local_1d0 <= local_110 && local_110 != *local_1d0) {
          *local_1d0 = local_110;
          (primal_dual_errors->max_dual_infeasibility).absolute_index = iVar12;
        }
        (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
             local_110 + (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities;
      }
      bVar11 = local_1e8->valid;
      if ((bool)bVar11 == true) {
        if (local_1f9 == kBasic) {
          if (local_110 <= 0.0) goto LAB_00254bf5;
          primal_dual_errors->num_nonzero_basic_duals =
               primal_dual_errors->num_nonzero_basic_duals + 1;
          pdVar15 = local_160;
          pdVar18 = local_168;
          pHVar20 = local_158;
          dVar31 = local_110;
          if (local_128 < local_110) goto LAB_00254bdf;
        }
        else {
          pdVar15 = local_148;
          pdVar18 = local_150;
          pHVar20 = local_140;
          dVar31 = local_118;
          if (0.0 < local_118) {
LAB_00254bdf:
            *pHVar20 = *pHVar20 + 1;
          }
        }
        dVar32 = *pdVar15;
        if (*pdVar15 <= dVar31) {
          dVar32 = dVar31;
        }
        *pdVar15 = dVar32;
        *pdVar18 = dVar31 + *pdVar18;
      }
LAB_00254bf5:
      local_1e0 = (pointer)CONCAT71(local_1e0._1_7_,bVar11);
      uVar29 = local_1f8->num_col_;
      uVar30 = (ulong)(int)uVar29;
      if (lVar27 < (long)uVar30 && (byte)local_1c0 == '\0') {
        if ((bool)bVar26 != false) {
          dVar31 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
          dVar32 = -dVar31;
          pvVar16 = &local_108;
          if (dVar32 < dVar31) {
            pvVar16 = &local_e8;
          }
          if (dVar31 <= dVar32) {
            dVar31 = dVar32;
          }
          (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar27] = dVar31;
        }
        piVar4 = (local_1f8->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        iVar12 = piVar4[lVar27];
        lVar17 = (long)iVar12;
        iVar28 = piVar4[lVar27 + 1];
        if (iVar12 < iVar28) {
          piVar4 = (local_1f8->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (local_1f8->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (local_1f0->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            iVar12 = piVar4[lVar17];
            dVar31 = pdVar5[lVar17];
            dVar32 = (double)local_1b8 * dVar31;
            if (dVar32 <= 0.0) {
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] =
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar12] - dVar32;
            }
            else {
              local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] =
                   dVar32 + local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar12];
            }
            if ((bool)bVar26 != false) {
              dVar31 = dVar31 * -pdVar6[iVar12];
              if (dVar31 <= 0.0) {
                local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27] =
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar27] - dVar31;
              }
              else {
                local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27] =
                     dVar31 + local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar27];
              }
            }
            lVar17 = lVar17 + 1;
          } while (iVar28 != lVar17);
        }
      }
      lVar27 = lVar27 + 1;
      iVar12 = local_1f8->num_row_;
      uVar22 = uVar29 + iVar12;
    } while (lVar27 < (int)uVar22);
  }
  pHVar7 = local_1f8;
  if ((bVar26 & 1) != 0) {
    (highs_info->super_HighsInfoStruct).max_complementarity_violation = 0.0;
    (highs_info->super_HighsInfoStruct).sum_complementarity_violations = 0.0;
    if (0 < (int)uVar22) {
      local_1b8 = (local_1f0->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_198 = (local_1f0->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1e0 = (local_1f8->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (local_1f8->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar27 = (long)(int)uVar29;
      pdVar24 = (local_1f0->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar27;
      pdVar15 = (local_1f0->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar27;
      pdVar18 = (local_1f8->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar27;
      pdVar25 = (local_1f8->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -lVar27;
      dVar32 = 0.0;
      uVar30 = 0;
      dVar31 = 0.0;
      do {
        pdVar10 = pdVar24;
        pdVar19 = pdVar18;
        pdVar21 = pdVar25;
        pdVar23 = pdVar15;
        if ((long)uVar30 < lVar27) {
          pdVar10 = local_1b8 + uVar30;
          pdVar23 = local_198 + uVar30;
          pdVar19 = local_1e0 + uVar30;
          pdVar21 = pdVar5 + uVar30;
        }
        dVar33 = *pdVar10;
        dVar1 = *pdVar19;
        dVar2 = *pdVar21;
        if ((-INFINITY < dVar1) || (dVar34 = 1.0, dVar2 < INFINITY)) {
          if ((dVar1 + dVar2) * 0.5 <= dVar33) {
            dVar34 = ABS(dVar2 - dVar33);
          }
          else {
            dVar34 = ABS(dVar1 - dVar33);
          }
        }
        dVar34 = ABS(*pdVar23) * dVar34;
        dVar32 = dVar32 + dVar34;
        (highs_info->super_HighsInfoStruct).sum_complementarity_violations = dVar32;
        if (dVar31 <= dVar34) {
          dVar31 = dVar34;
        }
        (highs_info->super_HighsInfoStruct).max_complementarity_violation = dVar31;
        uVar30 = uVar30 + 1;
        pdVar24 = pdVar24 + 1;
        pdVar15 = pdVar15 + 1;
        pdVar18 = pdVar18 + 1;
        pdVar25 = pdVar25 + 1;
      } while (uVar22 != uVar30);
    }
    getComplementarityViolations(local_1f8,local_1f0,&local_38,&local_40);
  }
  if (get_residuals) {
    if (0 < iVar12) {
      pdVar5 = (local_1f0->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar27 = 0;
      do {
        dVar31 = pdVar5[lVar27];
        if (0.0 <= dVar31) {
          dVar32 = dVar31 + local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar27];
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar27] = dVar32;
          dVar31 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        else {
          dVar31 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27] - dVar31;
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar27] = dVar31;
          dVar32 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        dVar33 = ABS(dVar31 - dVar32);
        if (1e-12 < dVar33) {
          *local_90 = *local_90 + 1;
        }
        if (local_1a8->absolute_value <= dVar33 && dVar33 != local_1a8->absolute_value) {
          local_1a8->absolute_value = dVar33;
          *local_80 = (HighsInt)lVar27;
        }
        dVar31 = dVar33 / (dVar31 + 1.0 + dVar32);
        if (*local_120 <= dVar31 && dVar31 != *local_120) {
          *local_120 = dVar31;
          *local_88 = (HighsInt)lVar27;
        }
        *local_70 = *local_70 + dVar33;
        lVar27 = lVar27 + 1;
      } while (lVar27 < pHVar7->num_row_);
    }
    if ((bVar26 & 1) == 0) {
      (highs_info->super_HighsInfoStruct).primal_solution_status =
           ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
      goto LAB_00255164;
    }
    if (0 < pHVar7->num_col_) {
      pdVar5 = (local_1f0->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar27 = 0;
      do {
        dVar31 = pdVar5[lVar27];
        if (0.0 <= dVar31) {
          dVar32 = dVar31 + local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar27];
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar27] = dVar32;
          dVar31 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        else {
          dVar31 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27] - dVar31;
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar27] = dVar31;
          dVar32 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        dVar33 = ABS(dVar31 - dVar32);
        if (1e-12 < dVar33) {
          *local_170 = *local_170 + 1;
        }
        if (local_1b0->absolute_value <= dVar33 && dVar33 != local_1b0->absolute_value) {
          local_1b0->absolute_value = dVar33;
          *local_178 = (HighsInt)lVar27;
        }
        dVar31 = dVar33 / (dVar31 + 1.0 + dVar32);
        if (*local_188 <= dVar31 && dVar31 != *local_188) {
          *local_188 = dVar31;
          *local_180 = (HighsInt)lVar27;
        }
        *local_138 = *local_138 + dVar33;
        lVar27 = lVar27 + 1;
      } while (lVar27 < pHVar7->num_col_);
      goto LAB_00255108;
    }
    (highs_info->super_HighsInfoStruct).primal_solution_status =
         ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
  }
  else {
LAB_00255108:
    (highs_info->super_HighsInfoStruct).primal_solution_status =
         ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) + 1;
    if ((bVar26 & 1) == 0) goto LAB_00255164;
  }
  if ((highs_info->super_HighsInfoStruct).num_dual_infeasibilities == 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
  }
LAB_00255164:
  (primal_dual_errors->max_primal_infeasibility).absolute_value = *local_1c8;
  dVar31 = *local_1d0;
  (primal_dual_errors->max_dual_infeasibility).absolute_value = dVar31;
  (primal_dual_errors->max_dual_infeasibility).relative_value = dVar31;
  (primal_dual_errors->max_dual_infeasibility).relative_index =
       (primal_dual_errors->max_dual_infeasibility).absolute_index;
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getKktFailures(const HighsOptions& options, const HighsLp& lp,
                    const std::vector<double>& gradient,
                    const HighsSolution& solution, const HighsBasis& basis,
                    HighsInfo& highs_info,
                    HighsPrimalDualErrors& primal_dual_errors,
                    const bool get_residuals) {
  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  // highs_info are the values computed in this method.

  HighsInt& num_primal_infeasibility = highs_info.num_primal_infeasibilities;

  HighsInt& max_absolute_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.absolute_index;
  double& max_absolute_primal_infeasibility_value =
      highs_info.max_primal_infeasibility;
  HighsInt& max_relative_primal_infeasibility_index =
      primal_dual_errors.max_primal_infeasibility.relative_index;
  double& max_relative_primal_infeasibility_value =
      primal_dual_errors.max_primal_infeasibility.relative_value;

  double& sum_primal_infeasibility = highs_info.sum_primal_infeasibilities;

  HighsInt& num_dual_infeasibility = highs_info.num_dual_infeasibilities;

  HighsInt& max_dual_infeasibility_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
  double& max_dual_infeasibility_value = highs_info.max_dual_infeasibility;

  double& sum_dual_infeasibility = highs_info.sum_dual_infeasibilities;

  double& max_complementarity_violation =
      highs_info.max_complementarity_violation;
  double& sum_complementarity_violations =
      highs_info.sum_complementarity_violations;

  num_primal_infeasibility = kHighsIllegalInfeasibilityCount;
  max_absolute_primal_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  primal_dual_errors.max_primal_infeasibility.invalidate();
  highs_info.primal_solution_status = kSolutionStatusNone;

  num_dual_infeasibility = kHighsIllegalInfeasibilityCount;
  max_dual_infeasibility_value = kHighsIllegalInfeasibilityMeasure;
  sum_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;

  primal_dual_errors.max_dual_infeasibility.invalidate();
  highs_info.dual_solution_status = kSolutionStatusNone;

  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;

  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  const bool& have_basis = basis.valid;
  const bool have_integrality = (lp.integrality_.size() != 0);
  // Check that there is no dual solution if there's no primal solution
  assert(have_primal_solution || !have_dual_solution);
  // Check that there is no basis if there's no dual solution
  assert(have_dual_solution || !have_basis);

  if (have_primal_solution) {
    // There's a primal solution, so check its size and initialise the
    // infeasibility counts
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    num_primal_infeasibility = 0;
    max_absolute_primal_infeasibility_value = 0;
    sum_primal_infeasibility = 0;
    primal_dual_errors.max_primal_infeasibility.reset();
    if (have_dual_solution) {
      // There's a dual solution, so check its size and initialise the
      // infeasibility counts
      assert((int)solution.col_dual.size() >= lp.num_col_);
      assert((int)solution.row_dual.size() >= lp.num_row_);
      num_dual_infeasibility = 0;
      max_dual_infeasibility_value = 0;
      sum_dual_infeasibility = 0;
      primal_dual_errors.max_dual_infeasibility.reset();
    }
  }

  HighsInt& num_primal_residual = primal_dual_errors.num_primal_residual;

  HighsInt& max_absolute_primal_residual_index =
      primal_dual_errors.max_primal_residual.absolute_index;
  double& max_absolute_primal_residual_value =
      primal_dual_errors.max_primal_residual.absolute_value;
  HighsInt& max_relative_primal_residual_index =
      primal_dual_errors.max_primal_residual.relative_index;
  double& max_relative_primal_residual_value =
      primal_dual_errors.max_primal_residual.relative_value;

  double& sum_primal_residual = primal_dual_errors.sum_primal_residual;

  HighsInt& num_dual_residual = primal_dual_errors.num_dual_residual;

  HighsInt& max_absolute_dual_residual_index =
      primal_dual_errors.max_dual_residual.absolute_index;
  double& max_absolute_dual_residual_value =
      primal_dual_errors.max_dual_residual.absolute_value;
  HighsInt& max_relative_dual_residual_index =
      primal_dual_errors.max_dual_residual.relative_index;
  double& max_relative_dual_residual_value =
      primal_dual_errors.max_dual_residual.relative_value;

  double& sum_dual_residual = primal_dual_errors.sum_dual_residual;

  HighsInt& num_nonzero_basic_duals =
      primal_dual_errors.num_nonzero_basic_duals;
  HighsInt& num_large_nonzero_basic_duals =
      primal_dual_errors.num_large_nonzero_basic_duals;
  double& max_nonzero_basic_dual = primal_dual_errors.max_nonzero_basic_dual;
  double& sum_nonzero_basic_duals = primal_dual_errors.sum_nonzero_basic_duals;

  HighsInt& num_off_bound_nonbasic = primal_dual_errors.num_off_bound_nonbasic;
  double& max_off_bound_nonbasic = primal_dual_errors.max_off_bound_nonbasic;
  double& sum_off_bound_nonbasic = primal_dual_errors.sum_off_bound_nonbasic;

  // Initialise HighsPrimalDualErrors

  if (have_primal_solution && get_residuals) {
    num_primal_residual = 0;
    max_absolute_primal_residual_value = 0;
    sum_primal_residual = 0;
    primal_dual_errors.max_primal_residual.reset();
  } else {
    num_primal_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_primal_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_primal_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_primal_residual.invalidate();
  }
  if (have_dual_solution && get_residuals) {
    num_dual_residual = 0;
    max_absolute_dual_residual_value = 0;
    sum_dual_residual = 0;
    primal_dual_errors.max_dual_residual.reset();
  } else {
    num_dual_residual = kHighsIllegalInfeasibilityCount;
    max_absolute_dual_residual_value = kHighsIllegalInfeasibilityMeasure;
    sum_dual_residual = kHighsIllegalInfeasibilityMeasure;
    primal_dual_errors.max_dual_residual.invalidate();
  }
  if (have_basis) {
    num_nonzero_basic_duals = 0;
    num_large_nonzero_basic_duals = 0;
    max_nonzero_basic_dual = 0;
    sum_nonzero_basic_duals = 0;

    num_off_bound_nonbasic = 0;
    max_off_bound_nonbasic = 0;
    sum_off_bound_nonbasic = 0;
  } else {
    num_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    num_large_nonzero_basic_duals = kHighsIllegalInfeasibilityCount;
    max_nonzero_basic_dual = kHighsIllegalInfeasibilityMeasure;
    sum_nonzero_basic_duals = kHighsIllegalInfeasibilityMeasure;

    num_off_bound_nonbasic = kHighsIllegalInfeasibilityCount;
    max_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
    sum_off_bound_nonbasic = kHighsIllegalInfeasibilityMeasure;
  }

  // Without a primal solution, nothing can be done!
  if (!have_primal_solution) return;
  std::vector<double> primal_positive_sum;
  std::vector<double> primal_negative_sum;
  std::vector<double> dual_positive_sum;
  std::vector<double> dual_negative_sum;
  if (get_residuals) {
    primal_positive_sum.assign(lp.num_row_, 0);
    primal_negative_sum.assign(lp.num_row_, 0);
    if (have_dual_solution) {
      dual_positive_sum.resize(lp.num_col_);
      dual_negative_sum.resize(lp.num_col_);
    }
  }

  // Set status to a value so the compiler doesn't think it might be unassigned.
  HighsBasisStatus status = HighsBasisStatus::kNonbasic;
  // Set status_pointer to be NULL unless we have a basis, in which
  // case it's the pointer to status. Can't make it a pointer to the
  // entry of basis since this is const.
  const HighsBasisStatus* status_pointer = have_basis ? &status : NULL;

  double absolute_primal_infeasibility;
  double relative_primal_infeasibility;
  double dual_infeasibility;
  double value_residual;
  double lower;
  double upper;
  double value;
  double dual = 0;
  HighsVarType integrality = HighsVarType::kContinuous;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    if (iVar < lp.num_col_) {
      HighsInt iCol = iVar;
      lower = lp.col_lower_[iCol];
      upper = lp.col_upper_[iCol];
      value = solution.col_value[iCol];
      if (have_dual_solution) dual = solution.col_dual[iCol];
      if (have_basis) status = basis.col_status[iCol];
      if (have_integrality) integrality = lp.integrality_[iCol];
    } else {
      HighsInt iRow = iVar - lp.num_col_;
      lower = lp.row_lower_[iRow];
      upper = lp.row_upper_[iRow];
      value = solution.row_value[iRow];
      // @FlipRowDual -solution.row_dual[iRow]; became solution.row_dual[iRow];
      if (have_dual_solution) dual = solution.row_dual[iRow];
      if (have_basis) status = basis.row_status[iRow];
      integrality = HighsVarType::kContinuous;
    }
    // Flip dual according to lp.sense_
    dual *= (HighsInt)lp.sense_;

    const bool status_value_ok = getVariableKktFailures(
        primal_feasibility_tolerance, dual_feasibility_tolerance, lower, upper,
        value, dual, status_pointer, integrality, absolute_primal_infeasibility,
        relative_primal_infeasibility, dual_infeasibility, value_residual);
    if (!status_value_ok)
      highsLogUser(options.log_options, HighsLogType::kError,
                   "getKktFailures: %s %d status-value error: [%23.18g; "
                   "%23.18g; %23.18g] has "
                   "residual %g\n",
                   iVar < lp.num_col_ ? "Column" : "Row   ",
                   iVar < lp.num_col_ ? int(iVar) : int(iVar - lp.num_col_),
                   lower, value, upper, value_residual);
    assert(status_value_ok);
    // Accumulate primal infeasibilities
    if (absolute_primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    if (max_absolute_primal_infeasibility_value <
        absolute_primal_infeasibility) {
      max_absolute_primal_infeasibility_index = iVar;
      max_absolute_primal_infeasibility_value = absolute_primal_infeasibility;
    }
    if (max_relative_primal_infeasibility_value <
        relative_primal_infeasibility) {
      max_relative_primal_infeasibility_index = iVar;
      max_relative_primal_infeasibility_value = relative_primal_infeasibility;
    }
    sum_primal_infeasibility += absolute_primal_infeasibility;

    if (have_dual_solution) {
      // Accumulate dual infeasibilities
      if (dual_infeasibility > dual_feasibility_tolerance)
        num_dual_infeasibility++;
      if (max_dual_infeasibility_value < dual_infeasibility) {
        max_dual_infeasibility_value = dual_infeasibility;
        max_dual_infeasibility_index = iVar;
      }
      sum_dual_infeasibility += dual_infeasibility;
    }
    if (have_basis) {
      if (status == HighsBasisStatus::kBasic) {
        double abs_basic_dual = dual_infeasibility;
        if (abs_basic_dual > 0) {
          num_nonzero_basic_duals++;
          if (abs_basic_dual > dual_feasibility_tolerance)
            num_large_nonzero_basic_duals++;
          max_nonzero_basic_dual =
              std::max(abs_basic_dual, max_nonzero_basic_dual);
          sum_nonzero_basic_duals += abs_basic_dual;
        }
      } else {
        double off_bound_nonbasic = value_residual;
        if (off_bound_nonbasic > 0) num_off_bound_nonbasic++;
        max_off_bound_nonbasic =
            std::max(off_bound_nonbasic, max_off_bound_nonbasic);
        sum_off_bound_nonbasic += off_bound_nonbasic;
      }
    }
    if (iVar < lp.num_col_ && get_residuals) {
      HighsInt iCol = iVar;
      if (have_dual_solution) {
        if (gradient[iCol] > 0) {
          dual_positive_sum[iCol] = gradient[iCol];
        } else {
          dual_negative_sum[iCol] = -gradient[iCol];
        }
      }
      for (HighsInt el = lp.a_matrix_.start_[iCol];
           el < lp.a_matrix_.start_[iCol + 1]; el++) {
        HighsInt iRow = lp.a_matrix_.index_[el];
        double Avalue = lp.a_matrix_.value_[el];
        double term = value * Avalue;
        if (term > 0) {
          primal_positive_sum[iRow] += term;
        } else {
          primal_negative_sum[iRow] -= term;
        }
        // @FlipRowDual += became -=
        if (have_dual_solution) {
          double term = -solution.row_dual[iRow] * Avalue;
          if (term > 0) {
            dual_positive_sum[iCol] += term;
          } else {
            dual_negative_sum[iCol] -= term;
          }
        }
      }
    }
  }

  if (have_dual_solution) {
    // Determine the sum of complementarity violations
    max_complementarity_violation = 0;
    sum_complementarity_violations = 0;
    double primal_residual = 0;
    for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
      const bool is_col = iVar < lp.num_col_;
      const HighsInt iRow = iVar - lp.num_col_;
      const double primal =
          is_col ? solution.col_value[iVar] : solution.row_value[iRow];
      const double dual =
          is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
      const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
      const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
      if (lower <= -kHighsInf && upper >= kHighsInf) {
        // Free
        primal_residual = 1;
      } else {
        const double mid = (lower + upper) * 0.5;
        primal_residual = primal < mid ? std::fabs(lower - primal)
                                       : std::fabs(upper - primal);
      }
      const double dual_residual = std::fabs(dual);
      const double complementarity_violation = primal_residual * dual_residual;
      sum_complementarity_violations += complementarity_violation;
      max_complementarity_violation =
          std::max(complementarity_violation, max_complementarity_violation);
    }
    double check_max_complementarity_violation;
    double check_sum_complementarity_violations;
    const bool have_values = getComplementarityViolations(
        lp, solution, check_max_complementarity_violation,
        check_sum_complementarity_violations);
    assert(have_values);
    assert(check_max_complementarity_violation ==
           max_complementarity_violation);
    assert(check_sum_complementarity_violations ==
           sum_complementarity_violations);
  }

  if (get_residuals) {
    const double large_residual_error = 1e-12;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double term = -solution.row_value[iRow];
      if (term > 0) {
        primal_positive_sum[iRow] += term;
      } else {
        primal_negative_sum[iRow] -= term;
      }
      assert(primal_positive_sum[iRow] >= 0);
      assert(primal_negative_sum[iRow] >= 0);
      double absolute_primal_residual =
          std::fabs(primal_positive_sum[iRow] - primal_negative_sum[iRow]);
      double relative_primal_residual =
          absolute_primal_residual /
          (1 + primal_positive_sum[iRow] + primal_negative_sum[iRow]);

      if (absolute_primal_residual > large_residual_error)
        num_primal_residual++;
      if (max_absolute_primal_residual_value < absolute_primal_residual) {
        max_absolute_primal_residual_value = absolute_primal_residual;
        max_absolute_primal_residual_index = iRow;
      }
      if (max_relative_primal_residual_value < relative_primal_residual) {
        max_relative_primal_residual_value = relative_primal_residual;
        max_relative_primal_residual_index = iRow;
      }
      sum_primal_residual += absolute_primal_residual;
    }
    if (have_dual_solution) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        double term = -solution.col_dual[iCol];
        if (term > 0) {
          dual_positive_sum[iCol] += term;
        } else {
          dual_negative_sum[iCol] -= term;
        }
        assert(dual_positive_sum[iCol] >= 0);
        assert(dual_negative_sum[iCol] >= 0);
        double absolute_dual_residual =
            std::fabs(dual_positive_sum[iCol] - dual_negative_sum[iCol]);
        double relative_dual_residual =
            absolute_dual_residual /
            (1 + dual_positive_sum[iCol] + dual_negative_sum[iCol]);
        if (absolute_dual_residual > large_residual_error) num_dual_residual++;
        if (max_absolute_dual_residual_value < absolute_dual_residual) {
          max_absolute_dual_residual_value = absolute_dual_residual;
          max_absolute_dual_residual_index = iCol;
        }
        if (max_relative_dual_residual_value < relative_dual_residual) {
          max_relative_dual_residual_value = relative_dual_residual;
          max_relative_dual_residual_index = iCol;
        }
        sum_dual_residual += absolute_dual_residual;
      }
    }
  }
  // Assign primal solution status
  if (num_primal_infeasibility) {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  }
  if (have_dual_solution) {
    // Assign dual solution status
    if (num_dual_infeasibility) {
      highs_info.dual_solution_status = kSolutionStatusInfeasible;
    } else {
      highs_info.dual_solution_status = kSolutionStatusFeasible;
    }
  }
  // Assign the two entries in primal_dual_errors that are accumulated
  // in highs_info
  primal_dual_errors.max_primal_infeasibility.absolute_value =
      highs_info.max_primal_infeasibility;
  ;
  primal_dual_errors.max_dual_infeasibility.absolute_value =
      highs_info.max_dual_infeasibility;
  // Relative dual_infeasibility data is the same as absolute
  primal_dual_errors.max_dual_infeasibility.relative_value =
      primal_dual_errors.max_dual_infeasibility.absolute_value;
  primal_dual_errors.max_dual_infeasibility.relative_index =
      primal_dual_errors.max_dual_infeasibility.absolute_index;
}